

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

void amqp_messenger_do_work(AMQP_MESSENGER_HANDLE messenger_handle)

{
  MESSAGE_RECEIVER_STATE MVar1;
  AMQP_MESSENGER_CONFIG *pAVar2;
  char cVar3;
  int iVar4;
  AMQP_MESSENGER_STATE AVar5;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  LINK_HANDLE pLVar6;
  MESSAGE_SENDER_HANDLE message_sender;
  MESSAGE_RECEIVER_HANDLE message_receiver;
  char *pcVar7;
  _Bool local_a;
  _Bool is_timed_out;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
               ,"amqp_messenger_do_work",0x566,1,"Invalid argument (messenger_handle is NULL)");
    return;
  }
  AVar5 = messenger_handle->state;
  if (AVar5 == AMQP_MESSENGER_STATE_STARTING) {
    switch(messenger_handle->message_sender_current_state) {
    case MESSAGE_SENDER_STATE_IDLE:
      if (messenger_handle->message_sender == (MESSAGE_SENDER_HANDLE)0x0) goto LAB_0013b78d;
    case MESSAGE_SENDER_STATE_CLOSING:
    case MESSAGE_SENDER_STATE_ERROR:
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar7 = "messagesender reported unexpected state %d while messenger is starting";
        iVar4 = 0x536;
LAB_0013b77d:
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                   ,"process_state_changes",iVar4,1,pcVar7);
      }
LAB_0013b782:
      AVar5 = AMQP_MESSENGER_STATE_ERROR;
LAB_0013b784:
      update_messenger_state(messenger_handle,AVar5);
LAB_0013b78d:
      AVar5 = messenger_handle->state;
      break;
    case MESSAGE_SENDER_STATE_OPENING:
      iVar4 = is_timeout_reached(messenger_handle->last_message_sender_state_change_time,300,
                                 &local_a);
      if (iVar4 == 0) {
        if (local_a != true) goto LAB_0013b78d;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar7 = 
          "messenger failed to start (messagesender failed to start within expected timeout (%d secs))"
          ;
          iVar4 = 0x52c;
          goto LAB_0013b77d;
        }
        goto LAB_0013b782;
      }
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_0013b782;
      pcVar7 = "messenger failed to start (failed to verify messagesender start timeout)";
      iVar4 = 0x527;
      goto LAB_0013b77d;
    case MESSAGE_SENDER_STATE_OPEN:
      AVar5 = AMQP_MESSENGER_STATE_STARTED;
      goto LAB_0013b784;
    default:
      goto switchD_0013b674_default;
    }
  }
  else if (AVar5 == AMQP_MESSENGER_STATE_STARTED) {
    if (messenger_handle->message_sender_current_state != MESSAGE_SENDER_STATE_OPEN) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar7 = "messagesender reported unexpected state %d while messenger was started";
        iVar4 = 0x4ff;
        goto LAB_0013b77d;
      }
      goto LAB_0013b782;
    }
    if (messenger_handle->message_receiver != (MESSAGE_RECEIVER_HANDLE)0x0) {
      MVar1 = messenger_handle->message_receiver_current_state;
      if ((MVar1 == MESSAGE_RECEIVER_STATE_IDLE) || (MVar1 == MESSAGE_RECEIVER_STATE_ERROR)) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar7 = "messagereceiver reported unexpected state %d while messenger is starting";
          iVar4 = 0x515;
          goto LAB_0013b77d;
        }
      }
      else {
        if (MVar1 != MESSAGE_RECEIVER_STATE_OPENING) goto LAB_0013b78d;
        iVar4 = is_timeout_reached(messenger_handle->last_message_receiver_state_change_time,300,
                                   &is_timed_out);
        if (iVar4 == 0) {
          if (is_timed_out != true) goto LAB_0013b78d;
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            pcVar7 = 
            "messenger got an error (messagereceiver failed to start within expected timeout (%d secs))"
            ;
            iVar4 = 0x50e;
            goto LAB_0013b77d;
          }
        }
        else {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            pcVar7 = "messenger got an error (failed to verify messagereceiver start timeout)";
            iVar4 = 0x509;
            goto LAB_0013b77d;
          }
        }
      }
      goto LAB_0013b782;
    }
    goto LAB_0013b78d;
  }
  if (AVar5 != AMQP_MESSENGER_STATE_STARTED) {
    if (AVar5 != AMQP_MESSENGER_STATE_STARTING) goto LAB_0013ba7a;
switchD_0013b674_default:
    if (messenger_handle->message_sender != (MESSAGE_SENDER_HANDLE)0x0) goto LAB_0013ba7a;
    pAVar2 = messenger_handle->config;
    pLVar6 = create_link(false,messenger_handle->session_handle,&pAVar2->send_link,
                         pAVar2->iothub_host_fqdn,pAVar2->device_id,pAVar2->module_id);
    messenger_handle->sender_link = pLVar6;
    if (pLVar6 == (LINK_HANDLE)0x0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                   ,"create_message_sender",0x285,1,"Failed creating the message sender link");
      }
    }
    else {
      message_sender =
           messagesender_create(pLVar6,on_message_sender_state_changed_callback,messenger_handle);
      messenger_handle->message_sender = message_sender;
      if (message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar7 = "Failed creating the message sender (messagesender_create failed)";
          iVar4 = 0x28a;
LAB_0013b964:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                     ,"create_message_sender",iVar4,1,pcVar7);
        }
      }
      else {
        iVar4 = messagesender_open(message_sender);
        if (iVar4 == 0) goto LAB_0013ba7a;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar7 = "Failed opening the AMQP message sender.";
          iVar4 = 0x292;
          goto LAB_0013b964;
        }
      }
      destroy_message_sender(messenger_handle);
    }
    update_messenger_state(messenger_handle,AMQP_MESSENGER_STATE_ERROR);
    goto LAB_0013ba7a;
  }
  cVar3 = messenger_handle->receive_messages;
  if (((_Bool)cVar3 == true) && (messenger_handle->message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0)
     ) {
    pAVar2 = messenger_handle->config;
    pLVar6 = create_link(true,messenger_handle->session_handle,&pAVar2->receive_link,
                         pAVar2->iothub_host_fqdn,pAVar2->device_id,pAVar2->module_id);
    messenger_handle->receiver_link = pLVar6;
    if (pLVar6 == (LINK_HANDLE)0x0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                   ,"create_message_receiver",0x341,1,"Failed creating the message receiver link");
      }
    }
    else {
      message_receiver =
           messagereceiver_create
                     (pLVar6,on_message_receiver_state_changed_callback,messenger_handle);
      messenger_handle->message_receiver = message_receiver;
      if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar7 = "Failed creating the message receiver (messagereceiver_create failed)";
          iVar4 = 0x346;
LAB_0013ba31:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                     ,"create_message_receiver",iVar4,1,pcVar7);
        }
      }
      else {
        iVar4 = messagereceiver_open
                          (message_receiver,on_message_received_internal_callback,messenger_handle);
        if (iVar4 == 0) {
          cVar3 = messenger_handle->receive_messages;
          goto LAB_0013b849;
        }
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar7 = "Failed opening the AMQP message receiver.";
          iVar4 = 0x34c;
          goto LAB_0013ba31;
        }
      }
      destroy_message_receiver(messenger_handle);
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                 ,"manage_amqp_messengers",0x550,1,
                 "amqp_messenger_do_work warning (failed creating the message receiver [%s])",
                 messenger_handle->config->device_id);
    }
  }
  else {
LAB_0013b849:
    if ((cVar3 == '\0') && (messenger_handle->message_receiver != (MESSAGE_RECEIVER_HANDLE)0x0)) {
      destroy_message_receiver(messenger_handle);
    }
  }
LAB_0013ba7a:
  if (messenger_handle->state == AMQP_MESSENGER_STATE_STARTED) {
    message_queue_do_work(messenger_handle->send_queue);
  }
  if (messenger_handle->max_send_error_count <= messenger_handle->send_error_count) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                 ,"handle_errors_and_timeouts",0x55d,1,
                 "Reached max number of consecutive send failures (%s, %lu)",
                 messenger_handle->config->device_id,messenger_handle->max_send_error_count);
    }
    update_messenger_state(messenger_handle,AMQP_MESSENGER_STATE_ERROR);
  }
  return;
}

Assistant:

void amqp_messenger_do_work(AMQP_MESSENGER_HANDLE messenger_handle)
{
    if (messenger_handle == NULL)
    {
        LogError("Invalid argument (messenger_handle is NULL)");
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* msgr = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        process_state_changes(msgr);

        manage_amqp_messengers(msgr);

        if (msgr->state == AMQP_MESSENGER_STATE_STARTED)
        {
            message_queue_do_work(msgr->send_queue);
        }

        handle_errors_and_timeouts(msgr);
    }
}